

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O3

int netaddr_acl_from_strarray(netaddr_acl *acl,const_strarray *value)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  netaddr *pnVar5;
  size_t sVar6;
  size_t *psVar7;
  char *src;
  char *pcVar8;
  size_t __nmemb;
  
  free(acl->accept);
  free(acl->reject);
  acl->reject = (netaddr *)0x0;
  acl->reject_count = 0;
  acl->accept = (netaddr *)0x0;
  acl->accept_count = 0;
  acl->reject_first = false;
  acl->accept_default = false;
  *(undefined6 *)&acl->field_0x22 = 0;
  pcVar8 = value->value;
  if (pcVar8 == (char *)0x0) {
    return 0;
  }
  if (pcVar8 < value->value + value->length) {
    sVar6 = 0;
    __nmemb = 0;
    do {
      iVar2 = netaddr_acl_handle_keywords(acl,pcVar8);
      if (iVar2 != 0) {
        if (*pcVar8 == '-') {
          __nmemb = __nmemb + 1;
        }
        else {
          sVar6 = sVar6 + 1;
        }
      }
      sVar4 = strlen(pcVar8);
      pcVar8 = pcVar8 + sVar4 + 1;
    } while (pcVar8 < value->value + value->length);
  }
  else {
    __nmemb = 0;
    sVar6 = 0;
  }
  if (sVar6 == 0) {
LAB_00142653:
    if (__nmemb != 0) {
      pnVar5 = (netaddr *)calloc(__nmemb,0x12);
      acl->reject = pnVar5;
      if (pnVar5 == (netaddr *)0x0) goto LAB_00142712;
    }
    pcVar8 = value->value;
    iVar2 = 0;
    if ((pcVar8 != (char *)0x0) && (iVar2 = 0, pcVar8 < value->value + value->length)) {
      do {
        iVar3 = netaddr_acl_handle_keywords(acl,pcVar8);
        if (iVar3 != 0) {
          cVar1 = *pcVar8;
          if ((cVar1 == '-') || (src = pcVar8, cVar1 == '+')) {
            src = pcVar8 + 1;
          }
          if (cVar1 == '-') {
            iVar3 = netaddr_from_string(acl->reject + acl->reject_count,src);
            psVar7 = &acl->reject_count;
          }
          else {
            iVar3 = netaddr_from_string(acl->accept + acl->accept_count,src);
            psVar7 = &acl->accept_count;
          }
          if (iVar3 != 0) goto LAB_00142712;
          *psVar7 = *psVar7 + 1;
        }
        sVar6 = strlen(pcVar8);
        pcVar8 = pcVar8 + sVar6 + 1;
      } while (pcVar8 < value->value + value->length);
    }
  }
  else {
    pnVar5 = (netaddr *)calloc(sVar6,0x12);
    acl->accept = pnVar5;
    if (pnVar5 != (netaddr *)0x0) goto LAB_00142653;
LAB_00142712:
    free(acl->accept);
    free(acl->reject);
    acl->reject = (netaddr *)0x0;
    acl->reject_count = 0;
    acl->accept = (netaddr *)0x0;
    acl->accept_count = 0;
    acl->reject_first = false;
    acl->accept_default = false;
    *(undefined6 *)&acl->field_0x22 = 0;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
netaddr_acl_from_strarray(struct netaddr_acl *acl, const struct const_strarray *value) {
  size_t accept_count, reject_count;
  const char *ptr, *addr;

  accept_count = 0;
  reject_count = 0;

  /* clear acl struct and free existing data */
  netaddr_acl_remove(acl);

  /* count number of address entries */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (ptr[0] == '-') {
      reject_count++;
    }
    else {
      accept_count++;
    }
  }

  /* allocate memory */
  if (accept_count > 0) {
    acl->accept = calloc(accept_count, sizeof(struct netaddr));
    if (acl->accept == NULL) {
      goto from_entry_error;
    }
  }
  if (reject_count > 0) {
    acl->reject = calloc(reject_count, sizeof(struct netaddr));
    if (acl->reject == NULL) {
      goto from_entry_error;
    }
  }

  /* read netaddr strings into buffers */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (*ptr == '-' || *ptr == '+') {
      addr = &ptr[1];
    }
    else {
      addr = ptr;
    }

    if (*ptr == '-') {
      if (netaddr_from_string(&acl->reject[acl->reject_count], addr)) {
        goto from_entry_error;
      }
      acl->reject_count++;
    }
    else {
      if (netaddr_from_string(&acl->accept[acl->accept_count], addr)) {
        goto from_entry_error;
      }
      acl->accept_count++;
    }
  }
  return 0;

from_entry_error:
  netaddr_acl_remove(acl);
  return -1;
}